

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O0

void cmLoadedCommand::InstallSignalHandlers(char *name,int remove)

{
  int remove_local;
  char *name_local;
  
  LastName = name;
  if (name == (char *)0x0) {
    LastName = "????";
  }
  if (remove == 0) {
    signal(0xb,TrapsForSignalsCFunction);
    signal(7,TrapsForSignalsCFunction);
    signal(4,TrapsForSignalsCFunction);
  }
  else {
    signal(0xb,(__sighandler_t)0x0);
    signal(7,(__sighandler_t)0x0);
    signal(4,(__sighandler_t)0x0);
  }
  return;
}

Assistant:

static void InstallSignalHandlers(const char* name, int remove = 0)
  {
    cmLoadedCommand::LastName = name;
    if (!name) {
      cmLoadedCommand::LastName = "????";
    }

    if (!remove) {
      signal(SIGSEGV, TrapsForSignalsCFunction);
#ifdef SIGBUS
      signal(SIGBUS, TrapsForSignalsCFunction);
#endif
      signal(SIGILL, TrapsForSignalsCFunction);
    } else {
      signal(SIGSEGV, CM_NULLPTR);
#ifdef SIGBUS
      signal(SIGBUS, CM_NULLPTR);
#endif
      signal(SIGILL, CM_NULLPTR);
    }
  }